

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O2

void filter_8x1_pixels(__m256i *sig,__m256i *fil,__m256i *y)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i alVar4;
  undefined1 auVar5 [32];
  
  auVar1 = vpmaddwd_avx2((undefined1  [32])*fil,(undefined1  [32])*sig);
  auVar2 = vpmaddwd_avx2((undefined1  [32])fil[3],(undefined1  [32])sig[3]);
  auVar5 = vpmaddwd_avx2((undefined1  [32])fil[1],(undefined1  [32])sig[1]);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  auVar2 = vpmaddwd_avx2((undefined1  [32])fil[2],(undefined1  [32])sig[2]);
  auVar3 = vpminsd_avx2(auVar5,auVar2);
  auVar1 = vpaddd_avx2(auVar1,auVar3);
  auVar2 = vpmaxsd_avx2(auVar5,auVar2);
  auVar5._8_4_ = 0x40;
  auVar5._0_8_ = 0x4000000040;
  auVar5._12_4_ = 0x40;
  auVar5._16_4_ = 0x40;
  auVar5._20_4_ = 0x40;
  auVar5._24_4_ = 0x40;
  auVar5._28_4_ = 0x40;
  auVar2 = vpaddd_avx2(auVar2,auVar5);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  alVar4 = (__m256i)vpsrad_avx2(auVar1,7);
  *y = alVar4;
  return;
}

Assistant:

static inline void filter_8x1_pixels(const __m256i *sig /*sig[4]*/,
                                     const __m256i *fil /*fil[4]*/,
                                     __m256i *y) {
  __m256i a, a0, a1;

  a0 = _mm256_madd_epi16(fil[0], sig[0]);
  a1 = _mm256_madd_epi16(fil[3], sig[3]);
  a = _mm256_add_epi32(a0, a1);

  a0 = _mm256_madd_epi16(fil[1], sig[1]);
  a1 = _mm256_madd_epi16(fil[2], sig[2]);

  {
    const __m256i min = _mm256_min_epi32(a0, a1);
    a = _mm256_add_epi32(a, min);
  }
  {
    const __m256i max = _mm256_max_epi32(a0, a1);
    a = _mm256_add_epi32(a, max);
  }
  {
    const __m256i rounding = _mm256_set1_epi32(1 << (CONV8_ROUNDING_BITS - 1));
    a = _mm256_add_epi32(a, rounding);
    *y = _mm256_srai_epi32(a, CONV8_ROUNDING_BITS);
  }
}